

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_2c5412::ValueSetter::handleToken(ValueSetter *this,Token *token)

{
  token_type_e tVar1;
  pointer pcVar2;
  bool bVar3;
  string value;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  tVar1 = token->type;
  pcVar2 = (token->value)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + (token->value)._M_string_length);
  switch(this->state) {
  case st_top:
    QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"BMC","");
    bVar3 = QPDFTokenizer::Token::isWord(token,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      this->state = st_bmc;
    }
    break;
  case st_bmc:
    if (tVar1 - tt_space < 2) {
      QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
    }
    else {
      this->state = st_emc;
    }
  case st_emc:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"EMC","");
    bVar3 = QPDFTokenizer::Token::isWord(token,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      this->state = st_end;
      writeAppearance(this);
    }
    break;
  case st_end:
    QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void
ValueSetter::handleToken(QPDFTokenizer::Token const& token)
{
    QPDFTokenizer::token_type_e ttype = token.getType();
    std::string value = token.getValue();
    bool do_replace = false;
    switch (state) {
    case st_top:
        writeToken(token);
        if (token.isWord("BMC")) {
            state = st_bmc;
        }
        break;

    case st_bmc:
        if ((ttype == QPDFTokenizer::tt_space) || (ttype == QPDFTokenizer::tt_comment)) {
            writeToken(token);
        } else {
            state = st_emc;
        }
        // fall through to emc

    case st_emc:
        if (token.isWord("EMC")) {
            do_replace = true;
            state = st_end;
        }
        break;

    case st_end:
        writeToken(token);
        break;
    }
    if (do_replace) {
        writeAppearance();
    }
}